

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O2

float pbrt::findCameraFov(SP *camera)

{
  element_type *peVar1;
  undefined8 uVar2;
  ostream *poVar3;
  allocator<char> local_45;
  float local_44;
  string local_40 [32];
  undefined1 local_20 [16];
  
  peVar1 = (camera->super___shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>(local_40,"fov",&local_45);
  syntactic::ParamSet::findParam<float>
            ((ParamSet *)local_20,(string *)&(peVar1->super_Node).super_ParamSet);
  uVar2 = local_20._0_8_;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_20 + 8));
  std::__cxx11::string::~string(local_40);
  if (uVar2 == 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "warning - pbrt file has camera, but camera has no \'fov\' field; replacing with constant 30 degrees"
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
    local_44 = 30.0;
  }
  else {
    peVar1 = (camera->super___shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    std::__cxx11::string::string<std::allocator<char>>(local_40,"fov",&local_45);
    syntactic::ParamSet::findParam<float>
              ((ParamSet *)local_20,(string *)&(peVar1->super_Node).super_ParamSet);
    local_44 = **(float **)(local_20._0_8_ + 0x18);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_20 + 8));
    std::__cxx11::string::~string(local_40);
  }
  return local_44;
}

Assistant:

float findCameraFov(pbrt::syntactic::Camera::SP camera)
  {
    if (!camera->findParam<float>("fov")) {
      std::cerr << "warning - pbrt file has camera, but camera has no 'fov' field; replacing with constant 30 degrees" << std::endl;
      return 30;
    }
    return camera->findParam<float>("fov")->get(0);
  }